

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

void xmlXIncludeBaseFixup
               (xmlXIncludeCtxtPtr ctxt,xmlNodePtr cur,xmlNodePtr copy,xmlChar *targetBase)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *base;
  xmlChar *relBase;
  xmlNs ns;
  
  base = (xmlChar *)0x0;
  relBase = (xmlChar *)0x0;
  if (cur->type != XML_ELEMENT_NODE) {
    return;
  }
  iVar1 = xmlNodeGetBaseSafe(cur->doc,cur,&base);
  if (iVar1 < 0) {
    xmlXIncludeErrMemory(ctxt);
  }
  if ((base == (xmlChar *)0x0) || (iVar1 = xmlStrEqual(base,targetBase), iVar1 != 0)) {
LAB_001ad2d5:
    ns.prefix = (xmlChar *)0x0;
    ns._private = (void *)0x0;
    ns.context = (_xmlDoc *)0x0;
    ns.next = (_xmlNs *)0x0;
    ns.type = 0;
    ns._12_4_ = 0;
    ns.href = "http://www.w3.org/XML/1998/namespace";
    xmlUnsetNsProp(copy,&ns,"base");
  }
  else {
    iVar1 = xmlStrlen(base);
    if ((iVar1 < 0x7d1) && (iVar1 = xmlStrlen(targetBase), iVar1 < 0x7d1)) {
      iVar1 = xmlBuildRelativeURISafe(base,targetBase,&relBase);
      if (-1 < iVar1) {
        if (relBase == (xmlChar *)0x0) {
          xmlXIncludeErr(ctxt,cur,0x645,"Building relative URI failed: %s\n",base);
          goto LAB_001ad302;
        }
LAB_001ad354:
        pxVar2 = xmlStrchr(relBase,'/');
        if (pxVar2 == (xmlChar *)0x0) goto LAB_001ad2d5;
        iVar1 = xmlNodeSetBase(copy,relBase);
        if (-1 < iVar1) goto LAB_001ad302;
      }
    }
    else {
      relBase = xmlStrdup(base);
      if (relBase != (xmlChar *)0x0) goto LAB_001ad354;
    }
    xmlXIncludeErrMemory(ctxt);
  }
LAB_001ad302:
  (*xmlFree)(base);
  (*xmlFree)(relBase);
  return;
}

Assistant:

static void
xmlXIncludeBaseFixup(xmlXIncludeCtxtPtr ctxt, xmlNodePtr cur, xmlNodePtr copy,
                     const xmlChar *targetBase) {
    xmlChar *base = NULL;
    xmlChar *relBase = NULL;
    xmlNs ns;
    int res;

    if (cur->type != XML_ELEMENT_NODE)
        return;

    if (xmlNodeGetBaseSafe(cur->doc, cur, &base) < 0)
        xmlXIncludeErrMemory(ctxt);

    if ((base != NULL) && !xmlStrEqual(base, targetBase)) {
        if ((xmlStrlen(base) > XML_MAX_URI_LENGTH) ||
            (xmlStrlen(targetBase) > XML_MAX_URI_LENGTH)) {
            relBase = xmlStrdup(base);
            if (relBase == NULL) {
                xmlXIncludeErrMemory(ctxt);
                goto done;
            }
        } else if (xmlBuildRelativeURISafe(base, targetBase, &relBase) < 0) {
            xmlXIncludeErrMemory(ctxt);
            goto done;
        }
        if (relBase == NULL) {
            xmlXIncludeErr(ctxt, cur,
                    XML_XINCLUDE_HREF_URI,
                    "Building relative URI failed: %s\n",
                    base);
            goto done;
        }

        /*
         * If the new base doesn't contain a slash, it can be omitted.
         */
        if (xmlStrchr(relBase, '/') != NULL) {
            res = xmlNodeSetBase(copy, relBase);
            if (res < 0)
                xmlXIncludeErrMemory(ctxt);
            goto done;
        }
    }

    /*
     * Delete existing xml:base if bases are equal
     */
    memset(&ns, 0, sizeof(ns));
    ns.href = XML_XML_NAMESPACE;
    xmlUnsetNsProp(copy, &ns, BAD_CAST "base");

done:
    xmlFree(base);
    xmlFree(relBase);
}